

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<Statement,_std::default_delete<Statement>_> __thiscall Parser::single(Parser *this)

{
  unsigned_long_long uVar1;
  logic_error *this_00;
  undefined8 *in_RSI;
  Token local_58;
  Token token;
  
  TokenStream::next(&token,(TokenStream *)*in_RSI);
  if (Minus < token.type) {
LAB_00106f54:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Bad input.");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if ((0xccU >> (token.type & 0x1f) & 1) == 0) {
    if (token.type != Dot) {
      if (token.type == Comma) goto LAB_00106f24;
      goto LAB_00106f54;
    }
LAB_00106f03:
    std::make_unique<PrintStatement>();
    uVar1 = local_58.span.begin;
    local_58.span.begin = 0;
    this->tokenStream = (TokenStream *)uVar1;
    std::unique_ptr<PrintStatement,_std::default_delete<PrintStatement>_>::~unique_ptr
              ((unique_ptr<PrintStatement,_std::default_delete<PrintStatement>_> *)&local_58);
  }
  else {
    while (TokenStream::lookahead(&local_58,(TokenStream *)*in_RSI), local_58.type == token.type) {
      TokenStream::next(&local_58,(TokenStream *)*in_RSI);
    }
    switch(token.type) {
    case LeftAngledBracket:
      std::make_unique<ShiftLeftStatement,long_long&>((longlong *)&local_58);
      uVar1 = local_58.span.begin;
      local_58.span.begin = 0;
      this->tokenStream = (TokenStream *)uVar1;
      std::unique_ptr<ShiftLeftStatement,_std::default_delete<ShiftLeftStatement>_>::~unique_ptr
                ((unique_ptr<ShiftLeftStatement,_std::default_delete<ShiftLeftStatement>_> *)
                 &local_58);
      break;
    case RightAngledBracket:
      std::make_unique<ShiftRightStatement,long_long&>((longlong *)&local_58);
      uVar1 = local_58.span.begin;
      local_58.span.begin = 0;
      this->tokenStream = (TokenStream *)uVar1;
      std::unique_ptr<ShiftRightStatement,_std::default_delete<ShiftRightStatement>_>::~unique_ptr
                ((unique_ptr<ShiftRightStatement,_std::default_delete<ShiftRightStatement>_> *)
                 &local_58);
      break;
    default:
      if (token.type == Comma) {
LAB_00106f24:
        std::make_unique<InputStatement>();
        uVar1 = local_58.span.begin;
        local_58.span.begin = 0;
        this->tokenStream = (TokenStream *)uVar1;
        std::unique_ptr<InputStatement,_std::default_delete<InputStatement>_>::~unique_ptr
                  ((unique_ptr<InputStatement,_std::default_delete<InputStatement>_> *)&local_58);
        return (__uniq_ptr_data<Statement,_std::default_delete<Statement>,_true,_true>)
               (__uniq_ptr_data<Statement,_std::default_delete<Statement>,_true,_true>)this;
      }
      if (token.type != Dot) goto LAB_00106f54;
      goto LAB_00106f03;
    case Plus:
      std::make_unique<IncrementStatement,long_long&>((longlong *)&local_58);
      uVar1 = local_58.span.begin;
      local_58.span.begin = 0;
      this->tokenStream = (TokenStream *)uVar1;
      std::unique_ptr<IncrementStatement,_std::default_delete<IncrementStatement>_>::~unique_ptr
                ((unique_ptr<IncrementStatement,_std::default_delete<IncrementStatement>_> *)
                 &local_58);
      break;
    case Minus:
      std::make_unique<DecrementStatement,long_long&>((longlong *)&local_58);
      uVar1 = local_58.span.begin;
      local_58.span.begin = 0;
      this->tokenStream = (TokenStream *)uVar1;
      std::unique_ptr<DecrementStatement,_std::default_delete<DecrementStatement>_>::~unique_ptr
                ((unique_ptr<DecrementStatement,_std::default_delete<DecrementStatement>_> *)
                 &local_58);
    }
  }
  return (__uniq_ptr_data<Statement,_std::default_delete<Statement>,_true,_true>)
         (__uniq_ptr_data<Statement,_std::default_delete<Statement>,_true,_true>)this;
}

Assistant:

auto Parser::single() -> std::unique_ptr<Statement> {
    auto token = tokenStream.next();
    auto type = token.type;

    if (type == TokenKind::LeftAngledBracket || type == TokenKind::RightAngledBracket || type == TokenKind::Plus || type == TokenKind::Minus) {
        long long by = 1;
        while (tokenStream.lookahead().type == type) {
            tokenStream.next();
            by++;
        }

        switch (type) {
            case TokenKind::LeftAngledBracket:
                return std::make_unique<ShiftLeftStatement>(by);
            case TokenKind::RightAngledBracket:
                return std::make_unique<ShiftRightStatement>(by);
            case TokenKind::Plus:
                return std::make_unique<IncrementStatement>(by);
            case TokenKind::Minus:
                return std::make_unique<DecrementStatement>(by);
        }
    }

    switch (type) {
        case TokenKind::Dot:
            return std::make_unique<PrintStatement>();
        case TokenKind::Comma:
            return std::make_unique<InputStatement>();
        default: throw std::logic_error("Bad input."); // TODO: Improve message
    }
}